

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asyn-thread.c
# Opt level: O3

CURLcode Curl_resolver_is_resolved(connectdata *conn,Curl_dns_entry **entry)

{
  int iVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  uint uVar6;
  timediff_t tVar7;
  long lVar8;
  char *pcVar9;
  uint uVar10;
  bool bVar11;
  curltime cVar12;
  curltime newer;
  curltime older;
  
  pCVar2 = conn->data;
  pvVar3 = (conn->async).os_specific;
  *entry = (Curl_dns_entry *)0x0;
  if (pvVar3 == (void *)0x0) {
    return CURLE_COULDNT_RESOLVE_HOST;
  }
  pthread_mutex_lock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  iVar1 = *(int *)((long)pvVar3 + 0x20);
  pthread_mutex_unlock(*(pthread_mutex_t **)((long)pvVar3 + 0x18));
  if (iVar1 != 0) {
    pvVar3 = (conn->async).os_specific;
    Curl_addrinfo_callback
              (conn,*(int *)((long)pvVar3 + 0x34),*(Curl_addrinfo **)((long)pvVar3 + 0x38));
    *(undefined8 *)((long)pvVar3 + 0x38) = 0;
    if ((conn->async).dns != (Curl_dns_entry *)0x0) {
      destroy_async_data(&conn->async);
      *entry = (conn->async).dns;
      return CURLE_OK;
    }
    bVar11 = ((conn->bits).field_0x4 & 0x20) == 0;
    pcVar9 = "proxy";
    if (bVar11) {
      pcVar9 = "host";
    }
    Curl_failf(conn->data,"Could not resolve %s: %s",pcVar9,(conn->async).hostname);
    destroy_async_data(&conn->async);
    return bVar11 + CURLE_COULDNT_RESOLVE_PROXY;
  }
  cVar12 = Curl_now();
  uVar4 = (pCVar2->progress).t_startsingle.tv_sec;
  uVar5 = (pCVar2->progress).t_startsingle.tv_usec;
  older.tv_usec = uVar5;
  older.tv_sec = uVar4;
  newer._12_4_ = 0;
  newer.tv_sec = SUB128(cVar12._0_12_,0);
  newer.tv_usec = SUB124(cVar12._0_12_,8);
  older._12_4_ = 0;
  tVar7 = Curl_timediff(newer,older);
  lVar8 = 0;
  if (0 < tVar7) {
    lVar8 = tVar7;
  }
  if (*(int *)((long)pvVar3 + 8) == 0) {
    uVar6 = 1;
  }
  else {
    uVar10 = *(int *)((long)pvVar3 + 8) << (*(long *)((long)pvVar3 + 0x10) <= lVar8);
    uVar6 = 0xfa;
    if (uVar10 < 0xfa) {
      uVar6 = uVar10;
    }
    if ((lVar8 < *(long *)((long)pvVar3 + 0x10)) && (uVar10 < 0xfb)) goto LAB_00137cf4;
  }
  *(uint *)((long)pvVar3 + 8) = uVar6;
LAB_00137cf4:
  *(ulong *)((long)pvVar3 + 0x10) = lVar8 + (ulong)uVar6;
  Curl_expire(conn->data,(ulong)uVar6,EXPIRE_ASYNC_NAME);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_resolver_is_resolved(struct connectdata *conn,
                                   struct Curl_dns_entry **entry)
{
  struct Curl_easy *data = conn->data;
  struct thread_data   *td = (struct thread_data*) conn->async.os_specific;
  int done = 0;

  *entry = NULL;

  if(!td) {
    DEBUGASSERT(td);
    return CURLE_COULDNT_RESOLVE_HOST;
  }

  Curl_mutex_acquire(td->tsd.mtx);
  done = td->tsd.done;
  Curl_mutex_release(td->tsd.mtx);

  if(done) {
    getaddrinfo_complete(conn);

    if(!conn->async.dns) {
      CURLcode result = resolver_error(conn);
      destroy_async_data(&conn->async);
      return result;
    }
    destroy_async_data(&conn->async);
    *entry = conn->async.dns;
  }
  else {
    /* poll for name lookup done with exponential backoff up to 250ms */
    timediff_t elapsed = Curl_timediff(Curl_now(),
                                       data->progress.t_startsingle);
    if(elapsed < 0)
      elapsed = 0;

    if(td->poll_interval == 0)
      /* Start at 1ms poll interval */
      td->poll_interval = 1;
    else if(elapsed >= td->interval_end)
      /* Back-off exponentially if last interval expired  */
      td->poll_interval *= 2;

    if(td->poll_interval > 250)
      td->poll_interval = 250;

    td->interval_end = elapsed + td->poll_interval;
    Curl_expire(conn->data, td->poll_interval, EXPIRE_ASYNC_NAME);
  }

  return CURLE_OK;
}